

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O2

bool check_equal(vector<float,_std::allocator<float>_> *result,
                vector<float,_std::allocator<float>_> *expected)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  pointer pfVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  
  pfVar3 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
  pfVar4 = (expected->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar7 == (long)(expected->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar4 >> 2) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      fVar1 = pfVar3[uVar5];
      fVar2 = pfVar4[uVar5];
      if (1e-05 < ABS(fVar1 - fVar2)) {
        printf("result[%d] %f != %f expected[%d]\n",(double)fVar1,(double)fVar2,uVar5 & 0xffffffff);
        return false;
      }
    }
    bVar6 = true;
  }
  else {
    bVar6 = false;
    printf("result.size() = %d, expected.size() = %d\n");
  }
  return bVar6;
}

Assistant:

bool check_equal(const std::vector<float> & result, const std::vector<float> & expected) {
    if (result.size() != expected.size()) {
        printf("result.size() = %d, expected.size() = %d\n", (int)result.size(), (int)expected.size());
        return false;
    }
    for (int i = 0; i < result.size(); i++) {
        if(std::abs(result[i] - expected[i]) > 1e-5) {
            printf("result[%d] %f != %f expected[%d]\n", i, result[i], expected[i], i);
            return false;
        }
    }
    return true;
}